

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O2

Am_Value __thiscall Input_Char_Support::From_String(Input_Char_Support *this,char *string)

{
  undefined8 in_RAX;
  char *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar1;
  Am_Value AVar2;
  Am_Input_Char ch;
  Am_Input_Char local_14;
  
  local_14 = SUB84((ulong)in_RAX >> 0x20,0);
  Am_Input_Char::Am_Input_Char(&local_14,in_RDX,false);
  if ((long)local_14.code == 0) {
    Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
    aVar1 = extraout_RDX_00;
  }
  else {
    *(Am_ID_Tag *)&(this->super_Am_Type_Support)._vptr_Am_Type_Support =
         Am_Input_Char::Am_Input_Char_ID;
    this[1].super_Am_Type_Support._vptr_Am_Type_Support =
         (_func_int **)((ulong)(((uint)local_14 >> 0x10 & 0xfff) << 0x10) | (long)local_14.code);
    aVar1 = extraout_RDX;
  }
  AVar2.value.wrapper_value = aVar1.wrapper_value;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

Am_Value From_String(const char *string) const
  {
    Am_Input_Char ch(string, false);
    if (ch.code != 0)
      return ch;
    else
      return Am_No_Value;
  }